

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O3

char * rapidjson::internal::u64toa(uint64_t value,char *buffer)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  
  if (value < 100000000) {
    if (9999 < value) {
      uVar2 = value & 0xffffffff;
      uVar7 = (uint)(uVar2 / 10000);
      iVar1 = (int)value + uVar7 * -10000;
      uVar4 = (ulong)((uint)(uVar2 / 500000) & 0xfffffffe);
      uVar7 = ((int)(uVar2 / 10000) + ((uVar7 & 0xffff) / 100) * -100 & 0xffff) * 2;
      uVar3 = (uint)(iVar1 * 0x147b) >> 0x13;
      uVar2 = (ulong)(uVar3 * 2);
      uVar3 = (iVar1 + uVar3 * -100 & 0xffff) * 2;
      if (value < 10000000) {
        if (999999 < value) goto LAB_00106328;
        if (value < 100000) goto LAB_0010634e;
      }
      else {
        *buffer = GetDigitsLut()::cDigitsLut[uVar4];
        buffer = buffer + 1;
LAB_00106328:
        *buffer = GetDigitsLut()::cDigitsLut[uVar4 + 1];
        buffer = buffer + 1;
      }
      *buffer = GetDigitsLut()::cDigitsLut[uVar7];
      buffer = buffer + 1;
LAB_0010634e:
      *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar7 + 1];
      buffer[1] = GetDigitsLut()::cDigitsLut[uVar2];
      buffer[2] = GetDigitsLut()::cDigitsLut[uVar2 + 1];
      buffer[3] = GetDigitsLut()::cDigitsLut[uVar3];
      buffer[4] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar3 + 1];
      return buffer + 5;
    }
    iVar1 = (int)((value & 0xffffffff) / 100);
    uVar3 = iVar1 + (int)((value & 0xffffffff) / 100);
    uVar7 = ((int)value + iVar1 * -100) * 2;
    if (value < 1000) {
      if (99 < value) goto LAB_00106201;
      if (value < 10) goto LAB_00106222;
    }
    else {
      *buffer = GetDigitsLut()::cDigitsLut[uVar3];
      buffer = buffer + 1;
LAB_00106201:
      *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar3 + 1];
      buffer = buffer + 1;
    }
    *buffer = GetDigitsLut()::cDigitsLut[uVar7];
    buffer = buffer + 1;
LAB_00106222:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar7 + 1];
    return buffer + 1;
  }
  if (9999999999999999 < value) {
    uVar2 = value / 10000000000000000;
    if (value < 100000000000000000) {
      *buffer = (byte)uVar2 | 0x30;
      pcVar6 = buffer + 1;
    }
    else {
      uVar7 = (uint)uVar2;
      if (value < 1000000000000000000) {
        *(undefined2 *)buffer = *(undefined2 *)(GetDigitsLut()::cDigitsLut + uVar2 * 2);
        pcVar6 = buffer + 2;
      }
      else if (value < 10000000000000000000) {
        *buffer = (char)(uVar7 / 100) + '0';
        *(undefined2 *)(buffer + 1) =
             *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar7 % 100) * 2);
        pcVar6 = buffer + 3;
      }
      else {
        uVar2 = (ulong)((uVar7 % 100) * 2);
        *(undefined2 *)buffer =
             *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar7 / 100) * 2);
        buffer[2] = GetDigitsLut()::cDigitsLut[uVar2];
        buffer[3] = GetDigitsLut()::cDigitsLut[uVar2 + 1];
        pcVar6 = buffer + 4;
      }
    }
    uVar4 = (value % 10000000000000000) / 100000000;
    uVar2 = (value % 10000000000000000) % 100000000;
    uVar7 = (uint)(uVar4 / 10000);
    iVar1 = (int)uVar4 + uVar7 * -10000;
    uVar11 = (uint)(iVar1 * 0x147b) >> 0x13;
    uVar5 = (uint)(uVar2 / 10000);
    iVar9 = (int)uVar2 + uVar5 * -10000;
    uVar3 = (uint)(iVar9 * 0x147b) >> 0x13;
    *(undefined2 *)pcVar6 =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + ((uint)(uVar4 / 500000) & 0xfffffffe));
    *(undefined2 *)(pcVar6 + 2) =
         *(undefined2 *)
          (GetDigitsLut()::cDigitsLut +
          (ulong)((int)(uVar4 / 10000) + (uVar7 / 100) * -100 & 0xffff) * 2);
    *(undefined2 *)(pcVar6 + 4) = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)uVar11 * 2);
    *(undefined2 *)(pcVar6 + 6) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(iVar1 + uVar11 * -100 & 0xffff) * 2);
    *(undefined2 *)(pcVar6 + 8) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + ((uint)(uVar2 / 500000) & 0x1fe));
    *(undefined2 *)(pcVar6 + 10) =
         *(undefined2 *)
          (GetDigitsLut()::cDigitsLut +
          (ulong)((int)(uVar2 / 10000) + (uVar5 / 100) * -100 & 0xffff) * 2);
    *(undefined2 *)(pcVar6 + 0xc) = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)uVar3 * 2);
    *(undefined2 *)(pcVar6 + 0xe) =
         *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(iVar9 + uVar3 * -100 & 0xffff) * 2);
    return pcVar6 + 0x10;
  }
  uVar2 = value % 100000000;
  uVar4 = value / 100000000 & 0xffffffff;
  uVar7 = (uint)(uVar4 / 10000);
  iVar1 = (int)(value / 100000000) + uVar7 * -10000;
  uVar5 = (uint)(uVar4 / 500000) & 0xfffffffe;
  uVar10 = (ulong)(((int)(uVar4 / 10000) + ((uVar7 & 0xffff) / 100) * -100 & 0xffff) * 2);
  uVar7 = (uint)(iVar1 * 0x147b) >> 0x13;
  uVar8 = (ulong)(uVar7 * 2);
  uVar7 = (iVar1 + uVar7 * -100 & 0xffff) * 2;
  uVar3 = (uint)(uVar2 / 10000);
  iVar1 = (int)uVar2 + uVar3 * -10000;
  uVar4 = (ulong)((uint)(uVar2 / 500000) & 0x1fe);
  uVar3 = ((int)(uVar2 / 10000) + (uVar3 / 100) * -100 & 0xffff) * 2;
  uVar11 = (uint)(iVar1 * 0x147b) >> 0x13;
  uVar2 = (ulong)(uVar11 * 2);
  uVar11 = (iVar1 + uVar11 * -100 & 0xffff) * 2;
  if (value < 1000000000000000) {
    if (99999999999999 < value) goto LAB_0010624c;
    if (0x48c27394 < value >> 0xd) goto LAB_00106260;
    if (0xe8d4a50 < value >> 0xc) goto LAB_00106271;
    if (0x2e90edc < value >> 0xb) goto LAB_00106287;
    if (0x9502f8 < value >> 10) goto LAB_00106298;
    if (value < 1000000000) goto LAB_001062bf;
  }
  else {
    *buffer = GetDigitsLut()::cDigitsLut[uVar5];
    buffer = buffer + 1;
LAB_0010624c:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar5 + 1];
    buffer = buffer + 1;
LAB_00106260:
    *buffer = GetDigitsLut()::cDigitsLut[uVar10];
    buffer = buffer + 1;
LAB_00106271:
    *buffer = GetDigitsLut()::cDigitsLut[(uVar10 & 0xffff) + 1];
    buffer = buffer + 1;
LAB_00106287:
    *buffer = GetDigitsLut()::cDigitsLut[uVar8];
    buffer = buffer + 1;
LAB_00106298:
    *buffer = GetDigitsLut()::cDigitsLut[uVar8 + 1];
    buffer = buffer + 1;
  }
  *buffer = GetDigitsLut()::cDigitsLut[uVar7];
  buffer = buffer + 1;
LAB_001062bf:
  *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar7 + 1];
  buffer[1] = GetDigitsLut()::cDigitsLut[uVar4];
  buffer[2] = GetDigitsLut()::cDigitsLut[uVar4 + 1];
  buffer[3] = GetDigitsLut()::cDigitsLut[uVar3];
  buffer[4] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar3 + 1];
  buffer[5] = GetDigitsLut()::cDigitsLut[uVar2];
  buffer[6] = GetDigitsLut()::cDigitsLut[uVar2 + 1];
  buffer[7] = GetDigitsLut()::cDigitsLut[uVar11];
  buffer[8] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar11 + 1];
  return buffer + 9;
}

Assistant:

inline char* u64toa(uint64_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);
    const char* cDigitsLut = GetDigitsLut();
    const uint64_t  kTen8 = 100000000;
    const uint64_t  kTen9 = kTen8 * 10;
    const uint64_t kTen10 = kTen8 * 100;
    const uint64_t kTen11 = kTen8 * 1000;
    const uint64_t kTen12 = kTen8 * 10000;
    const uint64_t kTen13 = kTen8 * 100000;
    const uint64_t kTen14 = kTen8 * 1000000;
    const uint64_t kTen15 = kTen8 * 10000000;
    const uint64_t kTen16 = kTen8 * kTen8;

    if (value < kTen8) {
        uint32_t v = static_cast<uint32_t>(value);
        if (v < 10000) {
            const uint32_t d1 = (v / 100) << 1;
            const uint32_t d2 = (v % 100) << 1;

            if (v >= 1000)
                *buffer++ = cDigitsLut[d1];
            if (v >= 100)
                *buffer++ = cDigitsLut[d1 + 1];
            if (v >= 10)
                *buffer++ = cDigitsLut[d2];
            *buffer++ = cDigitsLut[d2 + 1];
        }
        else {
            // value = bbbbcccc
            const uint32_t b = v / 10000;
            const uint32_t c = v % 10000;

            const uint32_t d1 = (b / 100) << 1;
            const uint32_t d2 = (b % 100) << 1;

            const uint32_t d3 = (c / 100) << 1;
            const uint32_t d4 = (c % 100) << 1;

            if (value >= 10000000)
                *buffer++ = cDigitsLut[d1];
            if (value >= 1000000)
                *buffer++ = cDigitsLut[d1 + 1];
            if (value >= 100000)
                *buffer++ = cDigitsLut[d2];
            *buffer++ = cDigitsLut[d2 + 1];

            *buffer++ = cDigitsLut[d3];
            *buffer++ = cDigitsLut[d3 + 1];
            *buffer++ = cDigitsLut[d4];
            *buffer++ = cDigitsLut[d4 + 1];
        }
    }
    else if (value < kTen16) {
        const uint32_t v0 = static_cast<uint32_t>(value / kTen8);
        const uint32_t v1 = static_cast<uint32_t>(value % kTen8);

        const uint32_t b0 = v0 / 10000;
        const uint32_t c0 = v0 % 10000;

        const uint32_t d1 = (b0 / 100) << 1;
        const uint32_t d2 = (b0 % 100) << 1;

        const uint32_t d3 = (c0 / 100) << 1;
        const uint32_t d4 = (c0 % 100) << 1;

        const uint32_t b1 = v1 / 10000;
        const uint32_t c1 = v1 % 10000;

        const uint32_t d5 = (b1 / 100) << 1;
        const uint32_t d6 = (b1 % 100) << 1;

        const uint32_t d7 = (c1 / 100) << 1;
        const uint32_t d8 = (c1 % 100) << 1;

        if (value >= kTen15)
            *buffer++ = cDigitsLut[d1];
        if (value >= kTen14)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= kTen13)
            *buffer++ = cDigitsLut[d2];
        if (value >= kTen12)
            *buffer++ = cDigitsLut[d2 + 1];
        if (value >= kTen11)
            *buffer++ = cDigitsLut[d3];
        if (value >= kTen10)
            *buffer++ = cDigitsLut[d3 + 1];
        if (value >= kTen9)
            *buffer++ = cDigitsLut[d4];

        *buffer++ = cDigitsLut[d4 + 1];
        *buffer++ = cDigitsLut[d5];
        *buffer++ = cDigitsLut[d5 + 1];
        *buffer++ = cDigitsLut[d6];
        *buffer++ = cDigitsLut[d6 + 1];
        *buffer++ = cDigitsLut[d7];
        *buffer++ = cDigitsLut[d7 + 1];
        *buffer++ = cDigitsLut[d8];
        *buffer++ = cDigitsLut[d8 + 1];
    }
    else {
        const uint32_t a = static_cast<uint32_t>(value / kTen16); // 1 to 1844
        value %= kTen16;

        if (a < 10)
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));
        else if (a < 100) {
            const uint32_t i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else if (a < 1000) {
            *buffer++ = static_cast<char>('0' + static_cast<char>(a / 100));

            const uint32_t i = (a % 100) << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else {
            const uint32_t i = (a / 100) << 1;
            const uint32_t j = (a % 100) << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
            *buffer++ = cDigitsLut[j];
            *buffer++ = cDigitsLut[j + 1];
        }

        const uint32_t v0 = static_cast<uint32_t>(value / kTen8);
        const uint32_t v1 = static_cast<uint32_t>(value % kTen8);

        const uint32_t b0 = v0 / 10000;
        const uint32_t c0 = v0 % 10000;

        const uint32_t d1 = (b0 / 100) << 1;
        const uint32_t d2 = (b0 % 100) << 1;

        const uint32_t d3 = (c0 / 100) << 1;
        const uint32_t d4 = (c0 % 100) << 1;

        const uint32_t b1 = v1 / 10000;
        const uint32_t c1 = v1 % 10000;

        const uint32_t d5 = (b1 / 100) << 1;
        const uint32_t d6 = (b1 % 100) << 1;

        const uint32_t d7 = (c1 / 100) << 1;
        const uint32_t d8 = (c1 % 100) << 1;

        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
        *buffer++ = cDigitsLut[d5];
        *buffer++ = cDigitsLut[d5 + 1];
        *buffer++ = cDigitsLut[d6];
        *buffer++ = cDigitsLut[d6 + 1];
        *buffer++ = cDigitsLut[d7];
        *buffer++ = cDigitsLut[d7 + 1];
        *buffer++ = cDigitsLut[d8];
        *buffer++ = cDigitsLut[d8 + 1];
    }

    return buffer;
}